

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.h
# Opt level: O0

BOOL Js::CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<short,false,false>>
               (TypedArray<short,_false,_false> *obj)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  BOOL ret;
  TypedArray<short,_false,_false> *obj_local;
  
  bVar2 = VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<short,_false,_false>_>_>::
          HasVirtualTable(obj);
  uVar3 = (uint)bVar2;
  if (uVar3 == 0) {
    bVar2 = VirtualTableInfo<Js::TypedArray<short,_false,_false>_>::HasVirtualTable(obj);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CrossSite.h"
                                  ,0x1c,"(ret || VirtualTableInfo<T>::HasVirtualTable(obj))",
                                  "ret || VirtualTableInfo<T>::HasVirtualTable(obj)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  uVar4 = (**(code **)((long)(obj->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                             super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                             super_IRecyclerVisitedObject + 0x330))();
  if (uVar3 != uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CrossSite.h"
                                ,0x1d,"(ret == obj->IsCrossSiteObject())",
                                "ret == obj->IsCrossSiteObject()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return uVar3;
}

Assistant:

static BOOL IsCrossSiteObjectTyped(T * obj)
        {
            BOOL ret = VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(obj);
            Assert(ret || VirtualTableInfo<T>::HasVirtualTable(obj));
            Assert(ret == obj->IsCrossSiteObject());
            return ret;
        }